

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::ConditionBinsSelectExpr::serializeTo
          (ConditionBinsSelectExpr *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppEVar2;
  long lVar3;
  string_view name;
  string_view name_00;
  
  name._M_str = "target";
  name._M_len = 6;
  ASTSerializer::writeLink(serializer,name,this->target);
  if ((this->intersects)._M_extent._M_extent_value != 0) {
    name_00._M_str = "intersects";
    name_00._M_len = 10;
    ASTSerializer::startArray(serializer,name_00);
    sVar1 = (this->intersects)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      ppEVar2 = (this->intersects)._M_ptr;
      lVar3 = 0;
      do {
        ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar3));
        lVar3 = lVar3 + 8;
      } while (sVar1 << 3 != lVar3);
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

void ConditionBinsSelectExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.writeLink("target", target);
    if (!intersects.empty()) {
        serializer.startArray("intersects");
        for (auto item : intersects)
            serializer.serialize(*item);
        serializer.endArray();
    }
}